

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O1

QTemporaryFile * QTemporaryFile::createNativeFile(QFile *file)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined8 uVar6;
  QTemporaryFile *this;
  void *__buf;
  size_t __nbytes;
  long in_FS_OFFSET;
  char buffer [1024];
  undefined1 auStack_438 [1032];
  long local_30;
  size_t *psVar5;
  undefined4 extraout_var_00;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*((file->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d)->_vptr_QObjectData[7])
                    ();
  psVar5 = (size_t *)CONCAT44(extraout_var,iVar3);
  if (psVar5 != (size_t *)0x0) {
    __nbytes = *psVar5;
    uVar4 = (**(code **)(__nbytes + 0xb0))(psVar5,0xff00000);
    if ((uVar4 >> 0x15 & 1) == 0) {
      bVar2 = QIODevice::isOpen((QIODevice *)file);
      pp_Var1 = (file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject;
      if (bVar2) {
        iVar3 = (*pp_Var1[0xf])();
        uVar6 = CONCAT44(extraout_var_00,iVar3);
      }
      else {
        iVar3 = (*pp_Var1[0xd])(file,1);
        uVar6 = 0;
        this = (QTemporaryFile *)0x0;
        if ((char)iVar3 == '\0') goto LAB_0025c96b;
      }
      this = (QTemporaryFile *)operator_new(0x10);
      QTemporaryFile(this);
      iVar3 = (*(this->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject
                [0xd])(this,3);
      if ((char)iVar3 == '\0') {
        (*(this->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject[4])
                  (this);
        this = (QTemporaryFile *)0x0;
      }
      else {
        (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x11])(file,0);
        memset(auStack_438,0xaa,0x400);
        iVar3 = (int)auStack_438;
        __buf = (void *)QIODevice::read((QIODevice *)file,iVar3,(void *)0x400,__nbytes);
        while (0 < (long)__buf) {
          QIODevice::write((QIODevice *)this,iVar3,__buf,__nbytes);
          __buf = (void *)QIODevice::read((QIODevice *)file,iVar3,(void *)0x400,__nbytes);
        }
        (*(this->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject[0x11])
                  (this,0);
      }
      pp_Var1 = (file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject;
      if (bVar2) {
        (*pp_Var1[0x11])(file,uVar6);
      }
      else {
        (*pp_Var1[0xe])(file);
      }
      goto LAB_0025c96b;
    }
  }
  this = (QTemporaryFile *)0x0;
LAB_0025c96b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTemporaryFile *QTemporaryFile::createNativeFile(QFile &file)
{
    if (QAbstractFileEngine *engine = file.d_func()->engine()) {
        if (engine->fileFlags(QAbstractFileEngine::FlagsMask) & QAbstractFileEngine::LocalDiskFlag)
            return nullptr; // native already
        //cache
        bool wasOpen = file.isOpen();
        qint64 old_off = 0;
        if (wasOpen)
            old_off = file.pos();
        else if (!file.open(QIODevice::ReadOnly))
            return nullptr;
        //dump data
        QTemporaryFile *ret = new QTemporaryFile;
        if (ret->open()) {
            file.seek(0);
            char buffer[1024];
            while (true) {
                qint64 len = file.read(buffer, 1024);
                if (len < 1)
                    break;
                ret->write(buffer, len);
            }
            ret->seek(0);
        } else {
            delete ret;
            ret = nullptr;
        }
        //restore
        if (wasOpen)
            file.seek(old_off);
        else
            file.close();
        //done
        return ret;
    }
    return nullptr;
}